

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O3

void __thiscall DSeqActorNode::Destroy(DSeqActorNode *this)

{
  AActor *actor;
  
  if ((this->super_DSeqNode).m_StopSound < 0) goto LAB_002faf1a;
  actor = (this->m_Actor).field_0.p;
  if (actor == (AActor *)0x0) {
LAB_002faef5:
    actor = (AActor *)0x0;
  }
  else if (((actor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->m_Actor).field_0.p = (AActor *)0x0;
    goto LAB_002faef5;
  }
  S_StopSound(actor,4);
  if (0 < (this->super_DSeqNode).m_StopSound) {
    (*(this->super_DSeqNode).super_DObject._vptr_DObject[7])(this,0);
  }
LAB_002faf1a:
  DSeqNode::Destroy(&this->super_DSeqNode);
  return;
}

Assistant:

void DSeqActorNode::Destroy ()
{
	if (m_StopSound >= 0)
		S_StopSound (m_Actor, CHAN_BODY);
	if (m_StopSound >= 1)
		MakeSound (0, m_StopSound);
	Super::Destroy();
}